

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

Token * __thiscall Token_stream::get(Token *__return_storage_ptr__,Token_stream *this)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  long *plVar6;
  undefined8 uVar7;
  int iVar8;
  char ch;
  allocator<char> local_79;
  string s;
  string local_50;
  
  if (this->full == true) {
    this->full = false;
    Token::Token(__return_storage_ptr__,&this->buffer);
    return __return_storage_ptr__;
  }
  cVar2 = std::istream::get();
  iVar8 = (int)cVar2;
  uVar1 = iVar8 - 0x23;
  if (uVar1 < 0x36) {
    if ((0x50017e5UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((0x28064300000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        std::istream::unget();
        get_numeral((Roman_int *)&s,(istream *)&std::cin);
        uVar4 = Roman_int::as_int((Roman_int *)&s);
        std::__cxx11::string::~string((string *)&s);
        __return_storage_ptr__->kind = '8';
        __return_storage_ptr__->value = (double)uVar4;
        goto LAB_00104199;
      }
      goto LAB_001041bc;
    }
    __return_storage_ptr__->kind = cVar2;
  }
  else {
LAB_001041bc:
    iVar5 = isalpha(iVar8);
    if (iVar5 != 0) {
      s._M_dataplus._M_p = (pointer)&s.field_2;
      s._M_string_length = 0;
      s.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)&s);
      while (plVar6 = (long *)std::istream::get((char *)this->is),
            (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
        iVar8 = isalpha((int)cVar2);
        if ((iVar8 == 0) && (cVar2 != '_' && 9 < (int)cVar2 - 0x30U)) break;
        std::__cxx11::string::push_back((char)&s);
      }
      std::istream::unget();
      bVar3 = std::operator==(&s,"exit");
      if (bVar3) {
        __return_storage_ptr__->kind = 'Q';
      }
      else {
        bVar3 = std::operator==(&s,"sqrt");
        if (bVar3) {
          __return_storage_ptr__->kind = 'R';
        }
        else {
          bVar3 = std::operator==(&s,"pow");
          if (bVar3) {
            __return_storage_ptr__->kind = 'P';
          }
          else {
            bVar3 = std::operator==(&s,"const");
            if (bVar3) {
              __return_storage_ptr__->kind = 'C';
            }
            else {
              bVar3 = std::operator==(&s,"help");
              if (bVar3) {
                __return_storage_ptr__->kind = 'H';
              }
              else {
                bVar3 = std::operator==(&s,"ln");
                if (bVar3) {
                  __return_storage_ptr__->kind = 'N';
                }
                else {
                  bVar3 = std::operator==(&s,"from");
                  if (bVar3) {
                    __return_storage_ptr__->kind = 'F';
                  }
                  else {
                    bVar3 = std::operator==(&s,"to");
                    if (!bVar3) {
                      std::__cxx11::string::string((string *)&local_50,(string *)&s);
                      Token::Token(__return_storage_ptr__,'a',&local_50);
                      std::__cxx11::string::~string((string *)&local_50);
                      goto LAB_0010436e;
                    }
                    __return_storage_ptr__->kind = 'T';
                  }
                }
              }
            }
          }
        }
      }
      __return_storage_ptr__->value = 0.0;
      (__return_storage_ptr__->name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->name).field_2;
      (__return_storage_ptr__->name)._M_string_length = 0;
      (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
LAB_0010436e:
      std::__cxx11::string::~string((string *)&s);
      return __return_storage_ptr__;
    }
    iVar8 = isspace(iVar8);
    if (iVar8 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&s,"Bad token",&local_79);
      error(&s);
      uVar7 = std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&s);
      _Unwind_Resume(uVar7);
    }
    if (cVar2 != '\n') {
      get(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->kind = ';';
  }
  __return_storage_ptr__->value = 0.0;
LAB_00104199:
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Token Token_stream::get()
{
	if (full) { full = false; return buffer; }
	char ch;
	ch = is.get();
	switch (ch)
	{
	case '(':
	case ')':
	case '+':
	case '-':
	case '*':
	case '/':
	case '%':
	case ';':
	case ',':
	case '=':
	case '#':
		return Token(ch);
	case 'I':
	case 'V':
	case 'X':
	case 'L':
	case 'C':
	case 'D':
	case 'M':
	{
		cin.unget(); // put back character to read full double later
		double val = get_numeral(cin).as_int();
		return Token(number, val);
	}
	default:
		if (isalpha(ch))
		{
			string s;
			s += ch;
			while (is.get(ch) && (isalpha(ch) || isdigit(ch) || ch == '_'))
				s += ch;
			cin.unget();
			if (s == "exit")
				return Token(quit);
			if (s == "sqrt")
				return Token(square_root);
			if (s == "pow")
				return Token(power);
			if (s == "const")
				return Token(constant);
			if (s == "help")
				return Token(help);
			if (s == "ln")
				return Token(natural_log);
			if (s == "from")
				return Token(from);
			if (s == "to")
				return Token(to);
			return Token(name, s);
		}
		else if (isspace(ch))
		{
			if (ch == '\n')
				return Token(print);
			return get();
		}
		error("Bad token");
	}
}